

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_decompose.cpp
# Opt level: O0

void test<double>(string *filename,vector<unsigned_long,_std::allocator<unsigned_long>_> *dims,
                 int target_level)

{
  undefined4 in_EDX;
  double *in_RSI;
  vector<double,_std::allocator<double>_> data_ori;
  vector<double,_std::allocator<double>_> data;
  size_t num_elements;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000078;
  vector<double,_std::allocator<double>_> *in_stack_00000080;
  size_t *in_stack_000001f0;
  char *in_stack_000001f8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *this;
  undefined4 in_stack_ffffffffffffffe8;
  
  this = (vector<double,_std::allocator<double>_> *)0x0;
  std::__cxx11::string::c_str();
  MGARD::readfile<double>(in_stack_000001f8,in_stack_000001f0);
  std::vector<double,_std::allocator<double>_>::vector(this,in_stack_ffffffffffffffd8);
  test_decompose<double>(in_stack_00000080,in_stack_00000078,filename._4_4_);
  test_recompose<double>(in_stack_00000080,in_stack_00000078,filename._4_4_);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x10ad0c);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x10ad1b);
  MGARD::print_statistics<double>
            (in_RSI,(double *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(size_t)this);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffa0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void test(string filename, const vector<size_t>& dims, int target_level){
    size_t num_elements = 0;
    auto data = MGARD::readfile<T>(filename.c_str(), num_elements);
    auto data_ori(data);
    test_decompose(data, dims, target_level);
    test_recompose(data, dims, target_level);
    MGARD::print_statistics(data_ori.data(), data.data(), num_elements);
}